

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.hpp
# Opt level: O1

set<int,_std::less<int>,_std::allocator<int>_> * __thiscall
pstore::serialize::
read<std::set<int,std::less<int>,std::allocator<int>>,pstore::serialize::archive::range_reader<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>&>
          (set<int,_std::less<int>,_std::allocator<int>_> *__return_storage_ptr__,serialize *this,
          range_reader<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          *archive)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  span<unsigned_char,__1L> sp;
  _Rb_tree_impl<std::less<int>,_true> *p_Var3;
  extent_type<_1L> unaff_RBX;
  pointer unaff_R14;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> _StackY_48;
  
  sp.storage_.data_ = unaff_R14;
  sp.storage_.super_extent_type<_1L>.size_ = unaff_RBX.size_;
  flood<_1l>(sp);
  serializer<std::set<int,std::less<int>,std::allocator<int>>,void>::
  read<pstore::serialize::archive::range_reader<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>&>
            ((range_reader<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)this,(value_type *)&_StackY_48);
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  if (_StackY_48._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var1->_M_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var1->_M_header;
    p_Var3 = &(__return_storage_ptr__->_M_t)._M_impl;
  }
  else {
    p_Var2 = &_StackY_48._M_impl.super__Rb_tree_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color =
         _StackY_48._M_impl.super__Rb_tree_header._M_header._M_color;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
         _StackY_48._M_impl.super__Rb_tree_header._M_header._M_parent;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
         _StackY_48._M_impl.super__Rb_tree_header._M_header._M_left;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
         _StackY_48._M_impl.super__Rb_tree_header._M_header._M_right;
    (_StackY_48._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &p_Var1->_M_header;
    p_Var3 = &_StackY_48._M_impl;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count =
         _StackY_48._M_impl.super__Rb_tree_header._M_node_count;
    _StackY_48._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    _StackY_48._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
    _StackY_48._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  }
  (p_Var3->super__Rb_tree_header)._M_node_count = 0;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&_StackY_48);
  return __return_storage_ptr__;
}

Assistant:

Ty read (Archive && archive) {
            using T2 = typename std::remove_const<Ty>::type;
            typename details::aligned_storage<sizeof (T2), alignof (T2)>::type uninit_buffer;
            flood (&uninit_buffer);

            // Deserialize into the uninitialized buffer.
            auto & t2 = reinterpret_cast<T2 &> (uninit_buffer);
            read_uninit (std::forward<Archive> (archive), t2);

            // This object will destroy the remains of the T2 instance in uninit_buffer.
            auto dtor = [] (T2 * p) { p->~T2 (); };
            std::unique_ptr<T2, decltype (dtor)> d (&t2, dtor);
            return std::move (t2);
        }